

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O0

void __thiscall GPIO::RotaryDial::decode_dial(RotaryDial *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  function<void_(bool,_long)> *this_00;
  undefined4 extraout_var;
  __int_type_conflict _Var6;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RDI;
  time_point now;
  uint delta;
  uint seq;
  RotaryDial *in_stack_ffffffffffffff88;
  nanoseconds in_stack_ffffffffffffff90;
  duration<long,_std::ratio<1L,_1000000000L>_> *__args_1;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar7;
  __unspec local_35;
  int local_34;
  duration<long,std::ratio<1l,1000000000l>> local_30 [8];
  rep local_28;
  type local_19;
  rep local_18;
  uint local_10;
  uint local_c;
  
  uVar2 = DigitalIn::get_state((DigitalIn *)(in_RDI + 0x15));
  uVar3 = DigitalIn::get_state((DigitalIn *)(in_RDI + 0x1b));
  uVar4 = DigitalIn::get_state((DigitalIn *)(in_RDI + 0x1b));
  local_c = uVar2 ^ uVar3 | uVar4 << 1;
  local_10 = local_c - *(int *)((long)&in_RDI[0x27].__r + 4) & 3;
  *(uint *)((long)&in_RDI[0x27].__r + 4) = local_c;
  local_18 = std::chrono::_V2::steady_clock::now();
  uVar7 = false;
  if ((1 < (int)in_RDI[0x24].__r) && (uVar7 = false, in_RDI[0x23].__r != 0)) {
    local_28 = (rep)std::chrono::operator-
                              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                               in_stack_ffffffffffffff90.__r);
    local_34 = 500000000;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>(local_30,&local_34);
    local_19 = (type)std::chrono::
                     operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000000000L>_>
                               ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                CONCAT17(uVar7,in_stack_ffffffffffffffb8),in_RDI);
    std::__cmp_cat::__unspec::__unspec(&local_35,(__unspec *)0x0);
    uVar7 = std::operator>(local_19);
  }
  if ((bool)uVar7 != false) {
    in_RDI[0x23].__r = 0;
  }
  in_RDI[0x28].__r = local_18;
  this_00 = (function<void_(bool,_long)> *)(ulong)local_10;
  switch(this_00) {
  case (function<void_(bool,_long)> *)0x0:
    return;
  case (function<void_(bool,_long)> *)0x1:
    in_RDI[0x23].__r = in_RDI[0x23].__r + 1;
    break;
  case (function<void_(bool,_long)> *)0x2:
    return;
  case (function<void_(bool,_long)> *)0x3:
    in_RDI[0x23].__r = in_RDI[0x23].__r + -1;
  }
  iVar5 = std::abs((int)in_RDI[0x23].__r);
  if ((long)(int)in_RDI[0x24].__r <= CONCAT44(extraout_var,iVar5)) {
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffff90.__r);
    set_speed(in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
    if (in_RDI[0x23].__r < 1) {
      in_RDI[0x23].__r = 0;
      if (((in_RDI[0x27].__r & 1) != 0) &&
         (_Var6 = std::__atomic_base::operator_cast_to_long
                            ((__atomic_base<long> *)
                             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)),
         _Var6 == in_RDI[0x25].__r)) {
        return;
      }
      std::__atomic_base<long>::operator--((__atomic_base<long> *)(in_RDI + 0x21));
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_()> *)in_stack_ffffffffffffff90.__r);
      if (bVar1) {
        std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffff90.__r);
      }
    }
    else {
      in_RDI[0x23].__r = 0;
      if (((in_RDI[0x27].__r & 1) != 0) &&
         (_Var6 = std::__atomic_base::operator_cast_to_long
                            ((__atomic_base<long> *)
                             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)),
         _Var6 == in_RDI[0x26].__r)) {
        return;
      }
      std::__atomic_base<long>::operator++((__atomic_base<long> *)(in_RDI + 0x21));
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_()> *)in_stack_ffffffffffffff90.__r);
      if (bVar1) {
        std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffff90.__r);
      }
    }
    bVar1 = std::function::operator_cast_to_bool((function<void_(bool,_long)> *)0x1266a3);
    if (bVar1) {
      __args_1 = in_RDI + 9;
      bVar1 = local_10 == 1;
      std::__atomic_base::operator_cast_to_long
                ((__atomic_base<long> *)CONCAT17(bVar1,in_stack_ffffffffffffff98));
      std::function<void_(bool,_long)>::operator()(this_00,bVar1,(long)__args_1);
    }
    in_RDI[0x29].__r = local_18;
  }
  return;
}

Assistant:

void RotaryDial::decode_dial()
{
    // Get the current state, use a ^ b | b << 1 to generate a 2 bit sequence by turning the dial.
    // For the logic behind the next two lines see:
    // http://guy.carpenter.id.au/gaugette/2013/01/14/rotary-encoder-library-for-the-raspberry-pi/
    
    unsigned int seq   = (m_pin_a.get_state() ^ m_pin_b.get_state()) | m_pin_b.get_state() << 1;
    unsigned int delta = (seq - m_lastseq) & 0b11;
    
    //    delta	meaning
    //    0	no change
    //    1	1 step clockwise
    //    2	2 steps clockwise or counter-clockwise
    //    3	1 step counter clockwise
    
    // store value for next turn
    m_lastseq = seq;
    
    auto now = std::chrono::steady_clock::now();
    if (m_divider > 1 && m_encvalue && now - m_last_triggered > std::chrono::nanoseconds(500 * 1000 * 1000)) {
        // reset m_encvalue, it has run out of sync by some bounces, and
        // needs certainly less than half a second between two events in a grey sequence
        m_encvalue = 0;
    }
    m_last_triggered = now;
    
    switch (delta) {
        case 0:
            // no turn
            return;
        case 1:
            ++m_encvalue;
            break;
        case 2:
            // we could assume a fast turn to the last direction, but we simply
            // drop this result (actually, the interrupt driven approach on the
            // Raspberry is fast enough to never run into this case)
            return;
        case 3:
            --m_encvalue;
            break;
    }

    if (std::abs(m_encvalue) >= m_divider) {

        set_speed(now - m_last_dialed);
        
        if (m_encvalue > 0) {
            m_encvalue = 0;
            if (m_use_range && m_value == m_max) return;
            ++m_value;
            // call the function pointer
            if (f_up) f_up();
        } else {
            m_encvalue = 0;
            if (m_use_range && m_value == m_min) return;
            --m_value;
            // call the function pointer
            if (f_down) f_down();
        }
        
        // call the function pointer
        if (f_dialed) f_dialed(delta == 1, m_value);

        m_last_dialed = now;
    }
    
}